

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O2

void __thiscall
absl::lts_20250127::container_internal::
btree_node<absl::lts_20250127::container_internal::set_params<google::protobuf::Edition,_std::less<google::protobuf::Edition>,_std::allocator<google::protobuf::Edition>,_256,_false>_>
::transfer_n(btree_node<absl::lts_20250127::container_internal::set_params<google::protobuf::Edition,_std::less<google::protobuf::Edition>,_std::allocator<google::protobuf::Edition>,_256,_false>_>
             *this,size_type n,size_type dest_i,size_type src_i,
            btree_node<absl::lts_20250127::container_internal::set_params<google::protobuf::Edition,_std::less<google::protobuf::Edition>,_std::allocator<google::protobuf::Edition>,_256,_false>_>
            *src_node,allocator_type *alloc)

{
  template_ElementType<3UL> *ptVar1;
  template_ElementType<3UL> *ptVar2;
  long lVar3;
  
  ptVar1 = btree_node<absl::lts_20250127::container_internal::set_params<google::protobuf::Edition,std::less<google::protobuf::Edition>,std::allocator<google::protobuf::Edition>,256,false>>
           ::GetField<3ul>((btree_node<absl::lts_20250127::container_internal::set_params<google::protobuf::Edition,std::less<google::protobuf::Edition>,std::allocator<google::protobuf::Edition>,256,false>>
                            *)src_node);
  ptVar2 = btree_node<absl::lts_20250127::container_internal::set_params<google::protobuf::Edition,std::less<google::protobuf::Edition>,std::allocator<google::protobuf::Edition>,256,false>>
           ::GetField<3ul>((btree_node<absl::lts_20250127::container_internal::set_params<google::protobuf::Edition,std::less<google::protobuf::Edition>,std::allocator<google::protobuf::Edition>,256,false>>
                            *)this);
  for (lVar3 = 0; n << 2 != lVar3; lVar3 = lVar3 + 4) {
    *(undefined4 *)((long)ptVar2 + lVar3 + dest_i * 4) =
         *(undefined4 *)((long)ptVar1 + lVar3 + src_i * 4);
  }
  return;
}

Assistant:

void transfer_n(const size_type n, const size_type dest_i,
                  const size_type src_i, btree_node *src_node,
                  allocator_type *alloc) {
    next_generation();
    for (slot_type *src = src_node->slot(src_i), *end = src + n,
                   *dest = slot(dest_i);
         src != end; ++src, ++dest) {
      transfer(dest, src, alloc);
    }
  }